

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec4 val)

{
  pointer pGVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  invalid_argument *piVar4;
  pointer pGVar5;
  bool bVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  pGVar5 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pGVar5 == pGVar1;
  if (!bVar6) {
    sVar2 = name->_M_string_length;
    do {
      __n = (pGVar5->name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp((pGVar5->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        if (pGVar5->type != Vector4Float) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar4,"Tried to set GLShaderUniform with wrong type");
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pGVar5->isSet = true;
        if (bVar7) {
          if (!bVar6) {
            return;
          }
          break;
        }
      }
      pGVar5 = pGVar5 + 1;
      bVar6 = pGVar5 == pGVar1;
    } while (!bVar6);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"Tried to set nonexistent uniform with name ",name);
  std::invalid_argument::invalid_argument(piVar4,(string *)&bStack_48);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec4 val) {

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == RenderDataType::Vector4Float) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}